

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O3

void tcmalloc::ThreadCachePtr::InitThreadCachePtrLate(void)

{
  int iVar1;
  
  ThreadCache::InitModule();
  do {
    iVar1 = pthread_key_create((pthread_key_t *)&tls_key_,
                               InitThreadCachePtrLate::anon_class_1_0_00000001::__invoke);
    if (iVar1 != 0) {
      syscall(1,2,"Check failed: err == 0\n",0x17);
      abort();
    }
  } while (tls_key_ == -1);
  return;
}

Assistant:

void ThreadCachePtr::InitThreadCachePtrLate() {
  ASSERT(tls_key_ == kInvalidTLSKey);

  ThreadCache::InitModule();

#if !defined(NDEBUG) && defined(__GLIBC__)
  if constexpr (!kHaveGoodTLS) {
    // Lets force glibc to exercise SetTlsValue recursion case (in
    // GetSlow) in debug mode. For test coverage.
    TlsKey leaked;
    for (int i = 32; i > 0; i--) {
      CreateTlsKey(&leaked, nullptr);
    }
  }
#endif // !NDEBUG

  // NOTE: creating tls key is likely to recurse into malloc. So this
  // is "late" initialization. And we must not mark tls initialized
  // until this is complete.
  int err = CreateTlsKey(&tls_key_, +[] (void *ptr) -> void {
    ClearCacheTLS();

    ThreadCache::DeleteCache(static_cast<ThreadCache*>(ptr));
  });
  CHECK(err == 0);
}